

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve-names.cc
# Opt level: O0

Result __thiscall
wabt::anon_unknown_16::NameResolver::OnReturnCallIndirectExpr
          (NameResolver *this,ReturnCallIndirectExpr *expr)

{
  ReturnCallIndirectExpr *expr_local;
  NameResolver *this_local;
  
  if (((expr->decl).has_func_type & 1U) != 0) {
    ResolveFuncTypeVar(this,&(expr->decl).type_var);
  }
  ResolveTableVar(this,&expr->table);
  Result::Result((Result *)((long)&this_local + 4),Ok);
  return (Result)this_local._4_4_;
}

Assistant:

Result NameResolver::OnReturnCallIndirectExpr(ReturnCallIndirectExpr* expr) {
  if (expr->decl.has_func_type) {
    ResolveFuncTypeVar(&expr->decl.type_var);
  }
  ResolveTableVar(&expr->table);
  return Result::Ok;
}